

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse41.c
# Opt level: O1

void VP8EncDspInitSSE41(void)

{
  return;
}

Assistant:

WEBP_TSAN_IGNORE_FUNCTION void VP8EncDspInitSSE41(void) {
  VP8CollectHistogram = CollectHistogram_SSE41;
  VP8EncQuantizeBlock = QuantizeBlock_SSE41;
  VP8EncQuantize2Blocks = Quantize2Blocks_SSE41;
  VP8EncQuantizeBlockWHT = QuantizeBlockWHT_SSE41;
  VP8TDisto4x4 = Disto4x4_SSE41;
  VP8TDisto16x16 = Disto16x16_SSE41;
}